

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidUpsampleNearestNeighborsModeWithAlignCorners(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ostream *poVar6;
  Result local_f8;
  undefined4 local_cc;
  undefined1 local_c8 [8];
  Result res;
  UpsampleLayerParams *params;
  NeuralNetworkLayer *upsampleLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"probs",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_upsample(this_01)
  ;
  CoreML::Specification::UpsampleLayerParams::set_mode
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
             UpsampleLayerParams_InterpolationMode_NN);
  CoreML::Specification::UpsampleLayerParams::set_linearupsamplemode
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
             UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);
  CoreML::validate<(MLModelType)500>((Result *)local_c8,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_c8);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xbe4);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    CoreML::Specification::UpsampleLayerParams::set_mode
              ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
               UpsampleLayerParams_InterpolationMode_NN);
    CoreML::Specification::UpsampleLayerParams::set_linearupsamplemode
              ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
               UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);
    CoreML::validate<(MLModelType)500>(&local_f8,(Model *)&topIn);
    CoreML::Result::operator=((Result *)local_c8,&local_f8);
    CoreML::Result::~Result(&local_f8);
    bVar1 = CoreML::Result::good((Result *)local_c8);
    if (bVar1) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xbea);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"!((res).good())");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
    else {
      m1._oneof_case_[0] = 0;
    }
  }
  local_cc = 1;
  CoreML::Result::~Result((Result *)local_c8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidUpsampleNearestNeighborsModeWithAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode::UpsampleLayerParams_InterpolationMode_NN);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode::UpsampleLayerParams_InterpolationMode_NN);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);

    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}